

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

uint64 crnlib::rg_etc1::pack_etc1_block_solid_color(etc1_block *block,uint8 *pColor)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  undefined2 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ushort *puVar12;
  uint best_packed_c0;
  uint etc1_selector;
  uint inten;
  uint diff;
  uint trial_error;
  uint16 p2;
  uint16 p1;
  uint16 *pInverse_table;
  ushort *puStack_50;
  uint x;
  uint16 *pTable;
  int local_40;
  int c_plus_delta;
  int delta;
  int delta_range;
  uint c2;
  uint c1;
  uint i;
  int best_packed_c2;
  int best_packed_c1;
  int best_x;
  uint best_i;
  uint best_error;
  uint8 *pColor_local;
  etc1_block *block_local;
  
  best_x = -1;
  best_packed_c1 = 0;
  best_packed_c2 = 0;
  i = 0;
  c1 = 0;
  for (c2 = 0; c2 < 3; c2 = c2 + 1) {
    bVar1 = pColor[pack_etc1_block_solid_color::s_next_comp[c2]];
    bVar2 = pColor[pack_etc1_block_solid_color::s_next_comp[c2 + 1]];
    for (local_40 = -1; local_40 < 2; local_40 = local_40 + 1) {
      iVar6 = clamp<int>((uint)pColor[c2] + local_40,0,0xff);
      if (iVar6 == 0) {
        puStack_50 = &g_color8_to_etc_block_config_0_255;
      }
      else if (iVar6 == 0xff) {
        puStack_50 = (ushort *)&DAT_00232002;
      }
      else {
        puStack_50 = (ushort *)(g_color8_to_etc_block_config_1_to_254 + (long)(iVar6 + -1) * 0x18);
      }
      do {
        puVar12 = puStack_50 + 1;
        uVar11 = (uint)*puStack_50;
        uVar3 = *(ushort *)
                 (g_etc1_inverse_lookup + (ulong)bVar1 * 2 + (ulong)(uVar11 & 0xff) * 0x200);
        uVar4 = *(ushort *)
                 (g_etc1_inverse_lookup + (ulong)bVar2 * 2 + (ulong)(uVar11 & 0xff) * 0x200);
        iVar7 = square<int>(iVar6 - (uint)pColor[c2]);
        iVar8 = square<int>((int)(uint)uVar3 >> 8);
        iVar9 = square<int>((int)(uint)uVar4 >> 8);
        uVar10 = iVar7 + iVar8 + iVar9;
        if (uVar10 < (uint)best_x) {
          i = uVar3 & 0xff;
          c1 = uVar4 & 0xff;
          best_packed_c1 = c2;
          best_packed_c2 = uVar11;
          best_x = uVar10;
          if (uVar10 == 0) goto LAB_0020d498;
        }
        puStack_50 = puVar12;
      } while (*puVar12 != 0xffff);
    }
  }
LAB_0020d498:
  uVar11 = best_packed_c2 >> 1 & 7;
  (block->field_0).m_bytes[3] =
       (byte)((uVar11 | uVar11 << 3) << 2) | (byte)((best_packed_c2 & 1U) << 1);
  bVar1 = *(byte *)((long)&g_selector_index_to_etc1 + (long)(int)(best_packed_c2 >> 4 & 3));
  uVar5 = 0;
  if ((bVar1 & 2) != 0) {
    uVar5 = 0xffff;
  }
  *(undefined2 *)((long)&block->field_0 + 4) = uVar5;
  uVar5 = 0;
  if ((bVar1 & 1) != 0) {
    uVar5 = 0xffff;
  }
  *(undefined2 *)((long)&block->field_0 + 6) = uVar5;
  if ((best_packed_c2 & 1U) == 0) {
    block->m_low_color[(ulong)(uint)best_packed_c1 - 8] =
         (byte)((uint)best_packed_c2 >> 8) | (byte)((best_packed_c2 >> 8) << 4);
    block->m_low_color[(ulong)pack_etc1_block_solid_color::s_next_comp[(uint)best_packed_c1] - 8] =
         (byte)i | (byte)(i << 4);
    block->m_low_color[(ulong)pack_etc1_block_solid_color::s_next_comp[best_packed_c1 + 1] - 8] =
         (byte)c1 | (byte)(c1 << 4);
  }
  else {
    block->m_low_color[(ulong)(uint)best_packed_c1 - 8] = (uint8)((best_packed_c2 >> 8) << 3);
    block->m_low_color[(ulong)pack_etc1_block_solid_color::s_next_comp[(uint)best_packed_c1] - 8] =
         (uint8)(i << 3);
    block->m_low_color[(ulong)pack_etc1_block_solid_color::s_next_comp[best_packed_c1 + 1] - 8] =
         (uint8)(c1 << 3);
  }
  return (ulong)(uint)best_x;
}

Assistant:

static uint64 pack_etc1_block_solid_color(etc1_block& block, const uint8* pColor)
        {
            RG_ETC1_ASSERT(g_etc1_inverse_lookup[0][255]);

            static uint s_next_comp[4] = { 1, 2, 0, 1 };

            uint best_error = cUINT32_MAX, best_i = 0;
            int best_x = 0, best_packed_c1 = 0, best_packed_c2 = 0;

            // For each possible 8-bit value, there is a precomputed list of diff/inten/selector configurations that allow that 8-bit value to be encoded with no error.
            for (uint i = 0; i < 3; i++)
            {
                const uint c1 = pColor[s_next_comp[i]], c2 = pColor[s_next_comp[i + 1]];

                const int delta_range = 1;
                for (int delta = -delta_range; delta <= delta_range; delta++)
                {
                    const int c_plus_delta = rg_etc1::clamp<int>(pColor[i] + delta, 0, 255);

                    const uint16* pTable;
                    if (!c_plus_delta)
                    {
                        pTable = g_color8_to_etc_block_config_0_255[0];
                    }
                    else if (c_plus_delta == 255)
                    {
                        pTable = g_color8_to_etc_block_config_0_255[1];
                    }
                    else
                    {
                        pTable = g_color8_to_etc_block_config_1_to_254[c_plus_delta - 1];
                    }

                    do
                    {
                        const uint x = *pTable++;

#ifdef RG_ETC1_BUILD_DEBUG
                        const uint diff = x & 1;
                        const uint inten = (x >> 1) & 7;
                        const uint selector = (x >> 4) & 3;
                        const uint p0 = (x >> 8) & 255;
                        RG_ETC1_ASSERT(etc1_decode_value(diff, inten, selector, p0) == (uint)c_plus_delta);
#endif

                        const uint16* pInverse_table = g_etc1_inverse_lookup[x & 0xFF];
                        uint16 p1 = pInverse_table[c1];
                        uint16 p2 = pInverse_table[c2];
                        const uint trial_error = rg_etc1::square(c_plus_delta - pColor[i]) + rg_etc1::square(p1 >> 8) + rg_etc1::square(p2 >> 8);
                        if (trial_error < best_error)
                        {
                            best_error = trial_error;
                            best_x = x;
                            best_packed_c1 = p1 & 0xFF;
                            best_packed_c2 = p2 & 0xFF;
                            best_i = i;
                            if (!best_error)
                            {
                                goto found_perfect_match;
                            }
                        }
                    } while (*pTable != 0xFFFF);
                }
            }
        found_perfect_match:

            const uint diff = best_x & 1;
            const uint inten = (best_x >> 1) & 7;

            block.m_bytes[3] = static_cast<uint8>(((inten | (inten << 3)) << 2) | (diff << 1));

            const uint etc1_selector = g_selector_index_to_etc1[(best_x >> 4) & 3];
            *reinterpret_cast<uint16*>(&block.m_bytes[4]) = (etc1_selector & 2) ? 0xFFFF : 0;
            *reinterpret_cast<uint16*>(&block.m_bytes[6]) = (etc1_selector & 1) ? 0xFFFF : 0;

            const uint best_packed_c0 = (best_x >> 8) & 255;
            if (diff)
            {
                block.m_bytes[best_i] = static_cast<uint8>(best_packed_c0 << 3);
                block.m_bytes[s_next_comp[best_i]] = static_cast<uint8>(best_packed_c1 << 3);
                block.m_bytes[s_next_comp[best_i + 1]] = static_cast<uint8>(best_packed_c2 << 3);
            }
            else
            {
                block.m_bytes[best_i] = static_cast<uint8>(best_packed_c0 | (best_packed_c0 << 4));
                block.m_bytes[s_next_comp[best_i]] = static_cast<uint8>(best_packed_c1 | (best_packed_c1 << 4));
                block.m_bytes[s_next_comp[best_i + 1]] = static_cast<uint8>(best_packed_c2 | (best_packed_c2 << 4));
            }

            return best_error;
        }